

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::str_format_internal::ParsedFormatBase::MatchesConversions
          (ParsedFormatBase *this,bool allow_ignored,
          initializer_list<absl::lts_20240722::FormatConversionCharSet> convs)

{
  pointer pCVar1;
  bool bVar2;
  char c;
  int iVar3;
  InputValue *this_00;
  initializer_list<absl::lts_20240722::FormatConversionCharSet> convs_local;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> used;
  anon_class_16_2_e79d1295 add_if_valid_conv;
  
  convs_local._M_len = convs._M_len;
  convs_local._M_array = convs._M_array;
  add_if_valid_conv.convs = &convs_local;
  used._M_h._M_buckets = &used._M_h._M_single_bucket;
  used._M_h._M_bucket_count = 1;
  used._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  used._M_h._M_element_count = 0;
  used._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  used._M_h._M_rehash_policy._M_next_resize = 0;
  used._M_h._M_single_bucket = (__node_base_ptr)0x0;
  add_if_valid_conv.used = &used;
  pCVar1 = (this->items_).
           super__Vector_base<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(((this->items_).
               super__Vector_base<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem>_>
               ._M_impl.super__Vector_impl_data._M_start)->conv).width;
  do {
    if ((pointer)(this_00 + -5) == pCVar1) {
      bVar2 = used._M_h._M_element_count == convs_local._M_len || allow_ignored;
LAB_001117c4:
      std::
      _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&used._M_h);
      return bVar2;
    }
    if (((pointer)(this_00 + -5))->is_conversion == true) {
      if (this_00[1].value_ < -1) {
        iVar3 = UnboundConversion::InputValue::get_from_arg(this_00 + 1);
        bVar2 = MatchesConversions::anon_class_16_2_e79d1295::operator()
                          (&add_if_valid_conv,iVar3,'*');
        if (bVar2) goto LAB_0011176b;
      }
      else {
LAB_0011176b:
        if (this_00->value_ < -1) {
          iVar3 = UnboundConversion::InputValue::get_from_arg(this_00);
          bVar2 = MatchesConversions::anon_class_16_2_e79d1295::operator()
                            (&add_if_valid_conv,iVar3,'*');
          if (!bVar2) goto LAB_001117c2;
        }
        iVar3 = ((UnboundConversion *)(this_00 + -1))->arg_position;
        c = FormatConversionCharToChar(*(FormatConversionChar *)((long)(this_00 + 2) + 2));
        bVar2 = MatchesConversions::anon_class_16_2_e79d1295::operator()(&add_if_valid_conv,iVar3,c)
        ;
        if (bVar2) goto LAB_001117a9;
      }
LAB_001117c2:
      bVar2 = false;
      goto LAB_001117c4;
    }
LAB_001117a9:
    this_00 = this_00 + 8;
  } while( true );
}

Assistant:

bool ParsedFormatBase::MatchesConversions(
    bool allow_ignored,
    std::initializer_list<FormatConversionCharSet> convs) const {
  std::unordered_set<int> used;
  auto add_if_valid_conv = [&](int pos, char c) {
    if (static_cast<size_t>(pos) > convs.size() ||
        !Contains(convs.begin()[pos - 1], c))
      return false;
    used.insert(pos);
    return true;
  };
  for (const ConversionItem &item : items_) {
    if (!item.is_conversion) continue;
    auto &conv = item.conv;
    if (conv.precision.is_from_arg() &&
        !add_if_valid_conv(conv.precision.get_from_arg(), '*'))
      return false;
    if (conv.width.is_from_arg() &&
        !add_if_valid_conv(conv.width.get_from_arg(), '*'))
      return false;
    if (!add_if_valid_conv(conv.arg_position,
                           FormatConversionCharToChar(conv.conv)))
      return false;
  }
  return used.size() == convs.size() || allow_ignored;
}